

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Configtable_clear(_func_int_config_ptr *f)

{
  int local_14;
  int i;
  _func_int_config_ptr *f_local;
  
  if ((x4a != (s_x4 *)0x0) && (x4a->count != 0)) {
    if (f != (_func_int_config_ptr *)0x0) {
      for (local_14 = 0; local_14 < x4a->count; local_14 = local_14 + 1) {
        (*f)(x4a->tbl[local_14].data);
      }
    }
    for (local_14 = 0; local_14 < x4a->size; local_14 = local_14 + 1) {
      x4a->ht[local_14] = (s_x4node *)0x0;
    }
    x4a->count = 0;
  }
  return;
}

Assistant:

void Configtable_clear(int(*f)(struct config *))
{
  int i;
  if( x4a==0 || x4a->count==0 ) return;
  if( f ) for(i=0; i<x4a->count; i++) (*f)(x4a->tbl[i].data);
  for(i=0; i<x4a->size; i++) x4a->ht[i] = 0;
  x4a->count = 0;
  return;
}